

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EditorInterface.cpp
# Opt level: O0

void __thiscall EditorInterface::showSaveDialog(EditorInterface *this,function<void_()> *action)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  Vector2f *pVVar4;
  float *pfVar5;
  shared_ptr<gui::Button> saveRefuseButton;
  shared_ptr<gui::Button> saveSubmitButton;
  element_type *saveDialogPtr;
  shared_ptr<gui::DialogBox> saveDialog;
  undefined4 in_stack_fffffffffffffe40;
  float fVar6;
  anon_class_48_3_cdba91a0 *in_stack_fffffffffffffe48;
  Signal<gui::Widget_*,_const_sf::Vector2<float>_&> *in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  undefined1 recursive;
  String *in_stack_fffffffffffffe60;
  ContainerBase *in_stack_fffffffffffffe68;
  locale *in_stack_fffffffffffffe80;
  locale *locale;
  char *in_stack_fffffffffffffe88;
  __shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2> *this_00;
  Widget *in_stack_fffffffffffffe90;
  float local_140;
  float local_13c;
  float local_138;
  float local_134 [3];
  element_type *local_128;
  locale local_100 [64];
  element_type *local_c0;
  locale local_98 [56];
  element_type *local_60;
  locale local_48 [40];
  __shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2> local_20 [2];
  
  recursive = (undefined1)((ulong)in_stack_fffffffffffffe58 >> 0x38);
  std::__shared_ptr_access<gui::Panel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::Panel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1ae642);
  ::gui::Widget::sendToFront(in_stack_fffffffffffffe90);
  peVar1 = std::__shared_ptr_access<gui::Panel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::Panel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1ae658);
  (*(peVar1->super_Group).super_Container.super_ContainerBase._vptr_ContainerBase[3])(peVar1,1);
  std::__shared_ptr_access<gui::Panel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::Panel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1ae673);
  std::locale::locale(local_48);
  sf::String::String((String *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                     in_stack_fffffffffffffe80);
  ::gui::ContainerBase::getChild<gui::DialogBox>
            (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,(bool)recursive);
  sf::String::~String((String *)0x1ae6d9);
  std::locale::~locale(local_48);
  this_00 = local_20;
  local_60 = std::__shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
  peVar2 = std::__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1ae70a);
  std::locale::locale(local_98);
  sf::String::String((String *)peVar2,(char *)this_00,in_stack_fffffffffffffe80);
  ::gui::ContainerBase::getChild<gui::Button>
            (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,(bool)recursive);
  sf::String::~String((String *)0x1ae76a);
  std::locale::~locale(local_98);
  std::__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1ae784)
  ;
  ::gui::Signal<gui::Widget_*,_const_sf::Vector2<float>_&>::disconnectAll
            ((Signal<gui::Widget_*,_const_sf::Vector2<float>_&> *)0x1ae793);
  peVar3 = std::__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1ae7a2);
  locale = (locale *)&peVar3->onClick;
  local_c0 = local_60;
  std::function<void_()>::function
            ((function<void_()> *)in_stack_fffffffffffffe50,
             (function<void_()> *)in_stack_fffffffffffffe48);
  ::gui::Signal<gui::Widget*,sf::Vector2<float>const&>::
  connect<EditorInterface::showSaveDialog(std::function<void()>const&)::__0>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  showSaveDialog(std::function<void()>const&)::$_0::~__0((anon_class_48_3_cdba91a0 *)0x1ae806);
  std::__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1ae813);
  std::locale::locale(local_100);
  sf::String::String((String *)peVar2,(char *)this_00,locale);
  ::gui::ContainerBase::getChild<gui::Button>
            (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,(bool)recursive);
  sf::String::~String((String *)0x1ae873);
  std::locale::~locale(local_100);
  std::__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1ae88d)
  ;
  ::gui::Signal<gui::Widget_*,_const_sf::Vector2<float>_&>::disconnectAll
            ((Signal<gui::Widget_*,_const_sf::Vector2<float>_&> *)0x1ae89c);
  std::__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1ae8ab)
  ;
  local_128 = local_60;
  std::function<void_()>::function
            ((function<void_()> *)in_stack_fffffffffffffe50,
             (function<void_()> *)in_stack_fffffffffffffe48);
  ::gui::Signal<gui::Widget*,sf::Vector2<float>const&>::
  connect<EditorInterface::showSaveDialog(std::function<void()>const&)::__1>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  showSaveDialog(std::function<void()>const&)::$_1::~__1((anon_class_48_3_cdba91a0 *)0x1ae90f);
  peVar2 = std::__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1ae91c);
  (*(peVar2->super_Group).super_Container.super_ContainerBase._vptr_ContainerBase[3])(peVar2,1);
  std::__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1ae93c);
  local_134[0] = 80.0;
  peVar1 = std::__shared_ptr_access<gui::Panel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::Panel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1ae95e);
  pVVar4 = ::gui::Panel::getSize(peVar1);
  local_138 = pVVar4->x * 0.5;
  pfVar5 = std::min<float>(local_134,&local_138);
  fVar6 = *pfVar5;
  local_13c = 80.0;
  peVar1 = std::__shared_ptr_access<gui::Panel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<gui::Panel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1ae9cf);
  pVVar4 = ::gui::Panel::getSize(peVar1);
  local_140 = pVVar4->y * 0.5;
  pfVar5 = std::min<float>(&local_13c,&local_140);
  ::gui::Widget::setPosition
            ((Widget *)CONCAT44(fVar6,in_stack_fffffffffffffe40),(float)((ulong)pfVar5 >> 0x20),
             SUB84(pfVar5,0));
  std::shared_ptr<gui::Button>::~shared_ptr((shared_ptr<gui::Button> *)0x1aea3f);
  std::shared_ptr<gui::Button>::~shared_ptr((shared_ptr<gui::Button> *)0x1aea4c);
  std::shared_ptr<gui::DialogBox>::~shared_ptr((shared_ptr<gui::DialogBox> *)0x1aea59);
  return;
}

Assistant:

void EditorInterface::showSaveDialog(const std::function<void()>& action) {
    modalBackground_->sendToFront();
    modalBackground_->setVisible(true);
    auto saveDialog = modalBackground_->getChild<gui::DialogBox>("saveDialog");
    auto saveDialogPtr = saveDialog.get();

    auto saveSubmitButton = saveDialog->getChild<gui::Button>("saveSubmitButton");
    saveSubmitButton->onClick.disconnectAll();
    saveSubmitButton->onClick.connect([this,saveDialogPtr,action]() {
        saveDialogPtr->setVisible(false);
        modalBackground_->setVisible(false);
        editor_.saveBoard();
        action();    // FIXME: the action runs immediately and doesn't give gui time to update, do we want to run this in a Timer instance instead? Could that cause issues? (someone clears the timers, or we happen to run that in a different thread)
    });

    auto saveRefuseButton = saveDialog->getChild<gui::Button>("saveRefuseButton");
    saveRefuseButton->onClick.disconnectAll();
    saveRefuseButton->onClick.connect([this,saveDialogPtr,action]() {
        saveDialogPtr->setVisible(false);
        modalBackground_->setVisible(false);
        action();
    });

    saveDialog->setVisible(true);
    saveDialog->setPosition(
        std::min(80.0f, modalBackground_->getSize().x / 2.0f),
        std::min(80.0f, modalBackground_->getSize().y / 2.0f)
    );
}